

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O0

void dispatch_interrupt(Emulator *e)

{
  bool bVar1;
  byte bVar2;
  bool bVar3;
  u16 local_20;
  byte local_1d;
  Address vector;
  u8 mask;
  Bool delay;
  u8 interrupt;
  Bool was_halt;
  Emulator *e_local;
  
  bVar3 = CPU_STATE_HALT_BUG < (e->state).interrupt.state;
  if (((e->state).interrupt.ime != FALSE) || (bVar3)) {
    (e->state).interrupt.ime = FALSE;
    (e->state).interrupt.state = CPU_STATE_NORMAL;
    (e->state).reg.SP = (e->state).reg.SP - 1;
    write_u8_tick(e,(e->state).reg.SP,(u8)((e->state).reg.PC >> 8));
    bVar2 = (e->state).interrupt.new_if & (e->state).interrupt.ie;
    bVar1 = false;
    if ((bVar2 & 1) == 0) {
      if ((bVar2 & 2) == 0) {
        if ((bVar2 & 4) == 0) {
          if ((bVar2 & 8) == 0) {
            if ((bVar2 & 0x10) == 0) {
              local_20 = 0;
              local_1d = 0;
            }
            else {
              local_20 = 0x60;
              local_1d = 0x10;
            }
          }
          else {
            local_20 = 0x58;
            local_1d = 8;
          }
        }
        else {
          local_20 = 0x50;
          local_1d = 4;
          bVar1 = bVar3;
        }
      }
      else {
        local_20 = 0x48;
        local_1d = 2;
      }
    }
    else {
      local_20 = 0x40;
      local_1d = 1;
    }
    (e->state).interrupt.new_if = (e->state).interrupt.new_if & (local_1d ^ 0xff);
    (e->state).reg.SP = (e->state).reg.SP - 1;
    write_u8_tick(e,(e->state).reg.SP,(u8)(e->state).reg.PC);
    (e->state).reg.PC = local_20;
    if (bVar1) {
      tick(e);
    }
    tick(e);
    tick(e);
  }
  return;
}

Assistant:

static void dispatch_interrupt(Emulator* e) {
  Bool was_halt = INTR.state >= CPU_STATE_HALT;
  if (!(INTR.ime || was_halt)) {
    return;
  }

  INTR.ime = FALSE;
  INTR.state = CPU_STATE_NORMAL;

  /* Write MSB of PC. */
  RSP--; WRITE8(RSP, REG.PC >> 8);

  /* Now check which interrupt to raise, after having written the MSB of PC.
   * This behavior is needed to pass the ie_push mooneye-gb test. */
  u8 interrupt = INTR.new_if & INTR.ie;

  Bool delay = FALSE;
  u8 mask = 0;
  Address vector = 0;
  if (interrupt & IF_VBLANK) {
    HOOK(vblank_interrupt_i, PPU.frame);
    vector = 0x40;
    mask = IF_VBLANK;
  } else if (interrupt & IF_STAT) {
    HOOK(stat_interrupt_cccc, STAT.y_compare.irq ? 'Y' : '.',
         STAT.mode2.irq ? 'O' : '.', STAT.vblank.irq ? 'V' : '.',
         STAT.hblank.irq ? 'H' : '.');
    vector = 0x48;
    mask = IF_STAT;
  } else if (interrupt & IF_TIMER) {
    HOOK0(timer_interrupt_v);
    vector = 0x50;
    mask = IF_TIMER;
    delay = was_halt;
  } else if (interrupt & IF_SERIAL) {
    HOOK0(serial_interrupt_v);
    vector = 0x58;
    mask = IF_SERIAL;
  } else if (interrupt & IF_JOYPAD) {
    HOOK0(joypad_interrupt_v);
    vector = 0x60;
    mask = IF_JOYPAD;
  } else {
    /* Interrupt was canceled. */
    vector = 0;
    mask = 0;
  }

  INTR.new_if &= ~mask;

  /* Now write the LSB of PC. */
  RSP--; WRITE8(RSP, REG.PC);
  REG.PC = vector;

  if (delay) {
    tick(e);
  }
  tick(e);
  tick(e);
}